

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinusoidal_linear_chirp_source.cc
# Opt level: O3

void __thiscall
webrtc::SinusoidalLinearChirpSource::Run
          (SinusoidalLinearChirpSource *this,size_t frames,float *destination)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  undefined1 auVar7 [16];
  
  if (frames != 0) {
    sVar2 = this->current_index_;
    sVar3 = 0;
    do {
      auVar5._8_4_ = (int)(sVar2 >> 0x20);
      auVar5._0_8_ = sVar2;
      auVar5._12_4_ = 0x45300000;
      dVar6 = (auVar5._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0);
      dVar4 = dVar6 - this->delay_samples_;
      sVar1 = this->total_samples_;
      auVar7._8_4_ = (int)(sVar1 >> 0x20);
      auVar7._0_8_ = sVar1;
      auVar7._12_4_ = 0x45300000;
      if (((double)this->sample_rate_ * 0.5 <
           ((this->max_frequency_ + -5.0) * dVar4) /
           ((auVar7._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) + 5.0) ||
         (dVar6 < this->delay_samples_)) {
        destination[sVar3] = 0.0;
      }
      else {
        dVar4 = dVar4 / (double)this->sample_rate_;
        dVar4 = sin((dVar4 * 5.0 + this->k_ * 0.5 * dVar4 * dVar4) * 6.283185307179586);
        destination[sVar3] = (float)dVar4;
        sVar2 = this->current_index_;
      }
      sVar3 = sVar3 + 1;
      sVar2 = sVar2 + 1;
      this->current_index_ = sVar2;
    } while (frames != sVar3);
  }
  return;
}

Assistant:

void SinusoidalLinearChirpSource::Run(size_t frames, float* destination) {
  for (size_t i = 0; i < frames; ++i, ++current_index_) {
    // Filter out frequencies higher than Nyquist.
    if (Frequency(current_index_) > 0.5 * sample_rate_) {
      destination[i] = 0;
    } else {
      // Calculate time in seconds.
      if (current_index_ < delay_samples_) {
        destination[i] = 0;
      } else {
        // Sinusoidal linear chirp.
        double t = (current_index_ - delay_samples_) / sample_rate_;
        destination[i] =
            sin(2 * M_PI * (kMinFrequency * t + (k_ / 2) * t * t));
      }
    }
  }
}